

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O1

Vec_Str_t *
Gia_AigerWriteIntoMemoryStrPart
          (Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  uint uVar7;
  Vec_Str_t *p_00;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  
  pGVar5 = p->pObjs;
  pGVar5->Value = 0;
  iVar2 = vCis->nSize;
  iVar13 = 1;
  if (0 < (long)iVar2) {
    piVar6 = vCis->pArray;
    lVar14 = 0;
    do {
      iVar3 = piVar6[lVar14];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001d2af8;
      if (pGVar5 == (Gia_Obj_t *)0x0) goto LAB_001d232a;
      if ((~*(uint *)(pGVar5 + iVar3) & 0x9fffffff) != 0) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x3f3,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      lVar14 = lVar14 + 1;
      pGVar5[iVar3].Value = (uint)lVar14;
    } while (iVar2 != lVar14);
    iVar13 = (uint)lVar14 + 1;
  }
LAB_001d232a:
  iVar2 = vAnds->nSize;
  if (0 < (long)iVar2) {
    piVar6 = vAnds->pArray;
    lVar14 = 0;
    do {
      iVar3 = piVar6[lVar14];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001d2af8;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar10 = (uint)*(undefined8 *)(pGVar5 + iVar3);
      if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x3f8,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      pGVar5[iVar3].Value = iVar13 + (int)lVar14;
      lVar14 = lVar14 + 1;
    } while (iVar2 != lVar14);
  }
  iVar2 = p->nObjs;
  p_00 = (Vec_Str_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar2 * 3 - 1U) {
    iVar13 = iVar2 * 3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (char *)malloc((long)iVar13);
  }
  p_00->pArray = pcVar8;
  iVar2 = p_00->nSize;
  uVar10 = p_00->nCap;
  lVar14 = 0;
  do {
    cVar1 = "aig "[lVar14];
    if (iVar2 + (int)lVar14 == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pcVar8,0x10);
        }
        uVar10 = 0x10;
      }
      else {
        uVar4 = uVar10 * 2;
        if (SBORROW4(uVar10,uVar4) != 0 < (int)uVar10) {
          uVar10 = uVar4;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)malloc((ulong)uVar4);
          }
          else {
            pcVar8 = (char *)realloc(pcVar8,(ulong)uVar4);
          }
        }
      }
    }
    pcVar8[lVar14 + iVar2] = cVar1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  p_00->nSize = iVar2 + 4;
  p_00->nCap = uVar10;
  p_00->pArray = pcVar8;
  Vec_StrPrintNum(p_00,vAnds->nSize + vCis->nSize);
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d24ff;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d24ff:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = ' ';
  Vec_StrPrintNum(p_00,vCis->nSize - nRegs);
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d257c;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d257c:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = ' ';
  Vec_StrPrintNum(p_00,nRegs);
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d25f6;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d25f6:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = ' ';
  Vec_StrPrintNum(p_00,vCos->nSize - nRegs);
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d2678;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d2678:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = ' ';
  Vec_StrPrintNum(p_00,vAnds->nSize);
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d26f4;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d26f4:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = '\n';
  uVar9 = (ulong)(uint)vCos->nSize;
  if (0 < vCos->nSize) {
    lVar14 = 0;
    do {
      iVar2 = vCos->pArray[lVar14];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001d2af8;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar2;
      uVar10 = (uint)*(undefined8 *)pGVar5;
      if ((-1 < (int)uVar10) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x40d,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if ((int)uVar9 - nRegs <= lVar14) {
        uVar4 = pGVar5[-(ulong)(uVar10 & 0x1fffffff)].Value;
        if ((int)uVar4 < 0) goto LAB_001d2b17;
        Vec_StrPrintNum(p_00,(uVar10 >> 0x1d & 1) + uVar4 * 2);
        uVar10 = p_00->nCap;
        if (p_00->nSize == uVar10) {
          if ((int)uVar10 < 0x10) {
            if (p_00->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(p_00->pArray,0x10);
            }
            sVar15 = 0x10;
          }
          else {
            sVar15 = (ulong)uVar10 * 2;
            if ((int)sVar15 <= (int)uVar10) goto LAB_001d27f4;
            if (p_00->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar15);
            }
            else {
              pcVar8 = (char *)realloc(p_00->pArray,sVar15);
            }
          }
          p_00->pArray = pcVar8;
          p_00->nCap = (int)sVar15;
        }
LAB_001d27f4:
        iVar2 = p_00->nSize;
        p_00->nSize = iVar2 + 1;
        p_00->pArray[iVar2] = '\n';
      }
      lVar14 = lVar14 + 1;
      uVar9 = (ulong)vCos->nSize;
    } while (lVar14 < (long)uVar9);
  }
  uVar9 = (ulong)(uint)vCos->nSize;
  if (0 < vCos->nSize) {
    lVar14 = 0;
    do {
      iVar2 = vCos->pArray[lVar14];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001d2af8;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar2;
      uVar10 = (uint)*(undefined8 *)pGVar5;
      if ((-1 < (int)uVar10) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x417,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if (lVar14 < (int)uVar9 - nRegs) {
        uVar4 = pGVar5[-(ulong)(uVar10 & 0x1fffffff)].Value;
        if ((int)uVar4 < 0) goto LAB_001d2b17;
        Vec_StrPrintNum(p_00,(uVar10 >> 0x1d & 1) + uVar4 * 2);
        uVar10 = p_00->nCap;
        if (p_00->nSize == uVar10) {
          if ((int)uVar10 < 0x10) {
            if (p_00->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(p_00->pArray,0x10);
            }
            sVar15 = 0x10;
          }
          else {
            sVar15 = (ulong)uVar10 * 2;
            if ((int)sVar15 <= (int)uVar10) goto LAB_001d2910;
            if (p_00->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar15);
            }
            else {
              pcVar8 = (char *)realloc(p_00->pArray,sVar15);
            }
          }
          p_00->pArray = pcVar8;
          p_00->nCap = (int)sVar15;
        }
LAB_001d2910:
        iVar2 = p_00->nSize;
        p_00->nSize = iVar2 + 1;
        p_00->pArray[iVar2] = '\n';
      }
      lVar14 = lVar14 + 1;
      uVar9 = (ulong)vCos->nSize;
    } while (lVar14 < (long)uVar9);
  }
  if (0 < vAnds->nSize) {
    lVar14 = 0;
    do {
      iVar2 = vAnds->pArray[lVar14];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_001d2af8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar2;
      if ((int)pGVar5->Value < 0) {
LAB_001d2b17:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar9 = *(ulong *)pGVar5;
      if ((int)pGVar5[-(ulong)((uint)uVar9 & 0x1fffffff)].Value < 0) goto LAB_001d2b17;
      uVar10 = (uint)(uVar9 >> 0x20);
      if ((int)pGVar5[-(ulong)(uVar10 & 0x1fffffff)].Value < 0) goto LAB_001d2b17;
      uVar4 = ((uint)(uVar9 >> 0x1d) & 1) + pGVar5[-(ulong)((uint)uVar9 & 0x1fffffff)].Value * 2;
      uVar10 = (uVar10 >> 0x1d & 1) + pGVar5[-(ulong)(uVar10 & 0x1fffffff)].Value * 2;
      if (uVar4 == uVar10) {
        __assert_fail("uLit0 != uLit1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x425,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      uVar7 = uVar10;
      if (uVar10 < uVar4) {
        uVar7 = uVar4;
      }
      Gia_AigerWriteUnsigned(p_00,pGVar5->Value * 2 - uVar7);
      lVar11 = (ulong)uVar4 - (ulong)uVar10;
      lVar12 = -lVar11;
      if (0 < lVar11) {
        lVar12 = lVar11;
      }
      Gia_AigerWriteUnsigned(p_00,(uint)lVar12);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vAnds->nSize);
  }
  uVar10 = p_00->nCap;
  if (p_00->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar10 * 2;
      if ((int)sVar15 <= (int)uVar10) goto LAB_001d2a88;
      if (p_00->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar15);
      }
      else {
        pcVar8 = (char *)realloc(p_00->pArray,sVar15);
      }
    }
    p_00->pArray = pcVar8;
    p_00->nCap = (int)sVar15;
  }
LAB_001d2a88:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = 'c';
  return p_00;
}

Assistant:

Vec_Str_t * Gia_AigerWriteIntoMemoryStrPart( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Vec_Str_t * vBuffer;
    Gia_Obj_t * pObj;
    int nNodes = 0, i, uLit, uLit0, uLit1; 
    // set the node numbers to be used in the output file
    Gia_ManConst0(p)->Value = nNodes++;
    Gia_ManForEachObjVec( vCis, p, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) );
        pObj->Value = nNodes++;
    }
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        pObj->Value = nNodes++;
    }

    // write the header "M I L O A" where M = I + L + A
    vBuffer = Vec_StrAlloc( 3*Gia_ManObjNum(p) );
    Vec_StrPrintStr( vBuffer, "aig " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) + Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCos) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, "\n" );

    // write latch drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i < Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }
    // write output drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i >= Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }

    // write the nodes into the buffer
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        uLit  = Abc_Var2Lit( Gia_ObjValue(pObj), 0 );
        uLit0 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        uLit1 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin1(pObj)), Gia_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Gia_AigerWriteUnsigned( vBuffer, uLit  - uLit1 );
        Gia_AigerWriteUnsigned( vBuffer, uLit1 - uLit0 );
    }
    Vec_StrPrintStr( vBuffer, "c" );
    return vBuffer;
}